

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void ixmlNode_getElementsByTagNameNSRecursive
               (IXML_Node *n,char *namespaceURI,char *localName,IXML_NodeList **list)

{
  unsigned_short uVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  IXML_Node *pIVar3;
  char *name;
  char *nsURI;
  IXML_NodeList **list_local;
  char *localName_local;
  char *namespaceURI_local;
  IXML_Node *n_local;
  
  if (n != (IXML_Node *)0x0) {
    uVar1 = ixmlNode_getNodeType(n);
    if (uVar1 == 1) {
      __s1 = ixmlNode_getLocalName(n);
      __s2 = ixmlNode_getNamespaceURI(n);
      if ((((__s1 != (char *)0x0) && (__s2 != (char *)0x0)) &&
          ((iVar2 = strcmp(namespaceURI,__s2), iVar2 == 0 ||
           (iVar2 = strcmp(namespaceURI,"*"), iVar2 == 0)))) &&
         ((iVar2 = strcmp(__s1,localName), iVar2 == 0 || (iVar2 = strcmp(localName,"*"), iVar2 == 0)
          ))) {
        ixmlNodeList_addToNodeList(list,n);
      }
    }
    pIVar3 = ixmlNode_getFirstChild(n);
    ixmlNode_getElementsByTagNameNSRecursive(pIVar3,namespaceURI,localName,list);
    pIVar3 = ixmlNode_getNextSibling(n);
    ixmlNode_getElementsByTagNameNSRecursive(pIVar3,namespaceURI,localName,list);
  }
  return;
}

Assistant:

static void ixmlNode_getElementsByTagNameNSRecursive(
	/*! [in] . */
	IXML_Node *n,
	/*! [in] . */
	const char *namespaceURI,
	/*! [in] . */
	const char *localName,
	/*! [out] . */
	IXML_NodeList **list)
{
	const DOMString nsURI;
	const DOMString name;

	if (n != NULL) {
		if (ixmlNode_getNodeType(n) == eELEMENT_NODE) {
			name = ixmlNode_getLocalName(n);
			nsURI = ixmlNode_getNamespaceURI(n);

			if (name != NULL && nsURI != NULL &&
				(strcmp(namespaceURI, nsURI) == 0 ||
					strcmp(namespaceURI, "*") == 0) &&
				(strcmp(name, localName) == 0 ||
					strcmp(localName, "*") == 0)) {
				ixmlNodeList_addToNodeList(list, n);
			}
		}
		ixmlNode_getElementsByTagNameNSRecursive(
			ixmlNode_getFirstChild(n),
			namespaceURI,
			localName,
			list);
		ixmlNode_getElementsByTagNameNSRecursive(
			ixmlNode_getNextSibling(n),
			namespaceURI,
			localName,
			list);
	}
}